

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.h
# Opt level: O0

void __thiscall
protozero::CopyablePtr<perfetto::protos::gen::IPCFrame_RequestError>::CopyablePtr
          (CopyablePtr<perfetto::protos::gen::IPCFrame_RequestError> *this,
          CopyablePtr<perfetto::protos::gen::IPCFrame_RequestError> *other)

{
  IPCFrame_RequestError *this_00;
  CopyablePtr<perfetto::protos::gen::IPCFrame_RequestError> *other_local;
  CopyablePtr<perfetto::protos::gen::IPCFrame_RequestError> *this_local;
  
  perfetto::std::
  unique_ptr<perfetto::protos::gen::IPCFrame_RequestError,_std::default_delete<perfetto::protos::gen::IPCFrame_RequestError>_>
  ::unique_ptr(&this->ptr_,&other->ptr_);
  this_00 = (IPCFrame_RequestError *)operator_new(0x50);
  perfetto::protos::gen::IPCFrame_RequestError::IPCFrame_RequestError(this_00);
  perfetto::std::
  unique_ptr<perfetto::protos::gen::IPCFrame_RequestError,_std::default_delete<perfetto::protos::gen::IPCFrame_RequestError>_>
  ::reset(&other->ptr_,this_00);
  return;
}

Assistant:

CopyablePtr(CopyablePtr&& other) noexcept : ptr_(std::move(other.ptr_)) {
    other.ptr_.reset(new T());
  }